

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall
Instance::Instance(Instance *this,Graph *g,vector<Train,_std::allocator<Train>_> *trains,
                  uint32_t maxTimeSteps,context *c)

{
  uint uVar1;
  pointer pTVar2;
  pointer pvVar3;
  Z3_optimize p_Var4;
  Z3_ast_vector p_Var5;
  pointer pTVar6;
  pointer paVar7;
  ostream *poVar8;
  clock_t cVar9;
  clock_t cVar10;
  int iVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  EdgeSet reachable;
  stringstream bVarName;
  undefined1 local_258 [40];
  OccupiedType *local_230;
  Graph *local_228;
  vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
  *local_220;
  expr_vector *local_218;
  context local_210;
  undefined1 local_200 [24];
  size_type sStack_1e8;
  float local_1e0;
  size_t local_1d8;
  __node_base_ptr p_Stack_1d0;
  Z3_context local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  this->_vptr_Instance = (_func_int **)&PTR_enforceConstraints_00116c68;
  local_228 = &this->graph;
  this->constraint_t = 0.0;
  this->solve_t = 0.0;
  Graph::Graph(local_228,g);
  local_1c8 = (Z3_context)&this->trains;
  std::vector<Train,_std::allocator<Train>_>::vector
            ((vector<Train,_std::allocator<Train>_> *)local_1c8,trains);
  this->maxTimeSteps = maxTimeSteps;
  this->c = c;
  (this->solver).super_object.m_ctx = c;
  p_Var4 = (Z3_optimize)Z3_mk_optimize(c->m_ctx);
  (this->solver).m_opt = p_Var4;
  Z3_optimize_inc_ref(c->m_ctx,p_Var4);
  pTVar6 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar2 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_200._0_8_ = c;
  p_Var5 = (Z3_ast_vector)Z3_mk_ast_vector(c->m_ctx);
  Z3_ast_vector_inc_ref(*(Z3_context *)(local_200._0_8_ + 8),p_Var5);
  local_1c0 = (ulong)maxTimeSteps;
  local_200._8_8_ = p_Var5;
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )local_1b8,local_1c0,(value_type *)local_200,(allocator_type *)local_258);
  local_230 = &this->occupiedVars;
  std::
  vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
  ::vector(local_230,((long)pTVar6 - (long)pTVar2 >> 4) * -0x3333333333333333,
           (value_type *)local_1b8,(allocator_type *)&local_210);
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::~vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )local_1b8);
  z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)local_200);
  (this->borderVars).super_object.m_ctx = c;
  p_Var5 = (Z3_ast_vector)Z3_mk_ast_vector(c->m_ctx);
  local_218 = &this->borderVars;
  Z3_ast_vector_inc_ref(((local_218->super_object).m_ctx)->m_ctx,p_Var5);
  (this->borderVars).m_vector = p_Var5;
  local_220 = &this->trainPaths;
  std::
  vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
  ::vector(local_220,
           ((long)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
           (allocator_type *)local_1b8);
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constraints).super__Vector_base<z3::expr,_std::allocator<z3::expr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < g->vertexCount) {
    iVar11 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"border_",7);
      std::ostream::operator<<((ostream *)local_1a8,iVar11);
      std::__cxx11::stringbuf::str();
      z3::context::bool_const((context *)local_258,&c->m_enable_exceptions);
      Z3_ast_vector_push(((this->borderVars).super_object.m_ctx)->m_ctx,(this->borderVars).m_vector,
                         local_258._8_8_);
      z3::context::check_error((local_218->super_object).m_ctx);
      z3::ast::~ast((ast *)local_258);
      if ((context *)local_200._0_8_ != (context *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,
                        (ulong)((long)(_Hash_node_base **)local_200._16_8_ + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      iVar11 = iVar11 + 1;
    } while (iVar11 < g->vertexCount);
  }
  local_200._0_8_ = &p_Stack_1d0;
  local_200._8_8_ = (Z3_ast_vector)0x1;
  local_200._16_8_ = (_Hash_node_base *)0x0;
  sStack_1e8 = 0;
  local_1e0 = 1.0;
  local_1d8 = 0;
  p_Stack_1d0 = (__node_base_ptr)0x0;
  pTVar6 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pTVar6) {
    uVar15 = 0;
    do {
      Graph::paths((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                    *)local_258,local_228,pTVar6[uVar15].start.stopEdge,
                   pTVar6[uVar15].stops.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].stopEdge);
      pvVar3 = (local_220->
               super__Vector_base<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1b8._0_8_ =
           pvVar3[uVar15].
           super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1b8._8_8_ =
           *(pointer *)
            ((long)&pvVar3[uVar15].
                    super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
      local_1a8[0] = *(pointer *)
                      ((long)&pvVar3[uVar15].
                              super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x10);
      pvVar3[uVar15].
      super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_258._0_8_;
      *(undefined8 *)
       ((long)&pvVar3[uVar15].
               super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) = local_258._8_8_;
      *(undefined8 *)
       ((long)&pvVar3[uVar15].
               super__Vector_base<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) = local_258._16_8_;
      local_258._0_8_ = (pointer)0x0;
      local_258._8_8_ = (Z3_context)0x0;
      local_258._16_8_ = (pointer)0x0;
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::~vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                 *)local_1b8);
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::~vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                 *)local_258);
      uVar1 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar15].start.arrivalTime;
      uVar13 = (ulong)uVar1;
      if (uVar1 < maxTimeSteps) {
        do {
          local_1b8._0_8_ = c;
          paVar7 = (pointer)Z3_mk_ast_vector(c->m_ctx);
          Z3_ast_vector_inc_ref(*(Z3_context *)(local_1b8._0_8_ + 8),paVar7);
          plVar12 = (long *)(*(long *)&(local_230->
                                       super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar15].
                                       super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                       ._M_impl.super__Vector_impl_data + uVar13 * 0x10);
          local_1b8._8_8_ = paVar7;
          Z3_ast_vector_inc_ref(*(Z3_context *)(local_1b8._0_8_ + 8),paVar7);
          Z3_ast_vector_dec_ref(*(undefined8 *)(*plVar12 + 8),plVar12[1]);
          *plVar12 = local_1b8._0_8_;
          plVar12[1] = local_1b8._8_8_;
          z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl((ast_vector_tpl<z3::expr> *)local_1b8);
          if ((this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar14 = 0;
            do {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"occupies_",9)
              ;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_",1);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_",1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              plVar12 = (long *)(*(long *)&(local_230->
                                           super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar15].
                                           super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 0x10);
              std::__cxx11::stringbuf::str();
              z3::context::bool_const(&local_210,&c->m_enable_exceptions);
              Z3_ast_vector_push(*(undefined8 *)(*plVar12 + 8),plVar12[1],local_210.m_ctx);
              z3::context::check_error((context *)*plVar12);
              z3::ast::~ast((ast *)&local_210);
              if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
                operator_delete((void *)local_258._0_8_,
                                (ulong)((long)&(((_Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>
                                                  *)local_258._16_8_)->_M_impl).
                                               super__Vector_impl_data._M_start + 1));
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              uVar14 = uVar14 + 1;
            } while (uVar14 < (ulong)((long)(this->graph).edges.
                                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->graph).edges.
                                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_1c0);
      }
      uVar15 = uVar15 + 1;
      pTVar6 = (trains->super__Vector_base<Train,_std::allocator<Train>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)(((long)(trains->super__Vector_base<Train,_std::allocator<Train>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 4)
                             * -0x3333333333333333));
  }
  cVar9 = clock();
  computeConstraints(this);
  cVar10 = clock();
  this->constraint_t = ((double)(cVar10 - cVar9) * 1000.0) / 1000000.0 + this->constraint_t;
  std::
  _Hashtable<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_Edge_*,_const_Edge_*,_std::allocator<const_Edge_*>,_std::__detail::_Identity,_std::equal_to<const_Edge_*>,_std::hash<const_Edge_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_200);
  return;
}

Assistant:

Instance::Instance(Graph g, std::vector<Train> trains, uint32_t maxTimeSteps,
                   context *c)
    : graph(g), trains(trains), maxTimeSteps(maxTimeSteps), c(c), solver(*c),
      occupiedVars(trains.size(), std::vector<expr_vector>(maxTimeSteps, *c)),
      borderVars(*c), trainPaths(trains.size()) {
  // init boundary variables
  for (int i = 0; i < g.vertexCount; i++) {
    std::stringstream bVarName;
    bVarName << "border_" << i;
    borderVars.push_back(c->bool_const(bVarName.str().c_str()));
  }

  EdgeSet reachable;
  // init occupied variables and train paths
  for (size_t train = 0; train < trains.size(); train++) {
    trainPaths[train] = graph.paths(trains[train].start.stopEdge,
                                    trains[train].stops.back().stopEdge);
    for (size_t time = trains[train].start.arrivalTime; time < maxTimeSteps;
         time++) {
      occupiedVars[train][time] = expr_vector(*c);
      for (size_t edge = 0; edge < graph.edges.size(); edge++) {
        std::stringstream oVarName;
        oVarName << "occupies_" << train << "_" << time << "_" << edge;
        occupiedVars[train][time].push_back(
            c->bool_const(oVarName.str().c_str()));
      }
    }
  }
  std::clock_t c_start = std::clock();
  computeConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
}